

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_test.cpp
# Opt level: O0

void test_function<Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd>
               (Function_affine_plane_in_Rd *fun)

{
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  lazy_ostream *plVar5;
  Scalar *pSVar6;
  ulong local_148;
  size_t i;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a8;
  assertion_result local_88;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60 [2];
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  VectorXd res_seed;
  VectorXd seed;
  Function_affine_plane_in_Rd *fun_local;
  
  Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::seed
            ((Function_affine_plane_in_Rd *)
             &res_seed.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::seed
            ((Function_affine_plane_in_Rd *)local_40);
  Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::operator()
            ((Function_affine_plane_in_Rd *)local_30,(VectorXd *)fun);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_60,0x32,&local_70);
    sVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       &res_seed.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows);
    sVar4 = Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::amb_d(fun);
    boost::test_tools::assertion_result::assertion_result(&local_88,sVar3 == sVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,"seed.size() == (long int)fun.amb_d()",0x24);
    boost::unit_test::operator<<(&local_a8,plVar5,&local_b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_88,&local_a8,&local_c8,0x32,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a8);
    boost::test_tools::assertion_result::~assertion_result(&local_88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x33,&local_e8);
    sVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
    sVar4 = Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::cod_d(fun);
    boost::test_tools::assertion_result::assertion_result(&local_100,sVar3 == sVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,"res_seed.size() == (long int)fun.cod_d()",0x28);
    boost::unit_test::operator<<(&local_120,plVar5,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&i,0x33,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  for (local_148 = 0; sVar3 = Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::cod_d(fun),
      local_148 < sVar3; local_148 = local_148 + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_30,
                        local_148);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pSVar6,0.0,1e-10);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &res_seed.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  return;
}

Assistant:

void test_function(const Function& fun) {
  Eigen::VectorXd seed = fun.seed();
  Eigen::VectorXd res_seed = fun(fun.seed());
  BOOST_CHECK(seed.size() == (long int)fun.amb_d());
  BOOST_CHECK(res_seed.size() == (long int)fun.cod_d());
  for (std::size_t i = 0; i < fun.cod_d(); i++) GUDHI_TEST_FLOAT_EQUALITY_CHECK(res_seed(i), 0., 1e-10);
}